

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMMParser.cpp
# Opt level: O2

bool __thiscall
cmm::CMMParser::parseConstantExpression
          (CMMParser *this,
          unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *Res)

{
  anon_union_8_3_6d9870f7_for_CMMLexer_5 aVar1;
  int iVar2;
  bool bVar3;
  StringAST *this_00;
  ExpressionAST *pEVar4;
  ExpressionAST *pEVar5;
  allocator local_39;
  string local_38;
  
  switch((this->Lexer).CurTok.Kind) {
  case String:
    this_00 = (StringAST *)operator_new(0x30);
    StringAST::StringAST(this_00,&(this->Lexer).StrVal);
    pEVar5 = (Res->_M_t).
             super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>.
             _M_t.
             super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
             super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
    (Res->_M_t).super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>.
    _M_t.super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
    super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl = (ExpressionAST *)this_00;
    goto LAB_00108f93;
  default:
    std::__cxx11::string::string
              ((string *)&local_38,"unknown token in literal constant expression",&local_39);
    bVar3 = CMMLexer::Error(&this->Lexer,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    return bVar3;
  case Integer:
    pEVar4 = (ExpressionAST *)operator_new(0x10);
    iVar2 = (this->Lexer).field_4.IntVal;
    pEVar4->Kind = IntExpression;
    (pEVar4->super_AST)._vptr_AST = (_func_int **)&PTR__AST_0011f860;
    *(int *)&pEVar4->field_0xc = iVar2;
    break;
  case Double:
    pEVar4 = (ExpressionAST *)operator_new(0x18);
    aVar1 = (this->Lexer).field_4;
    pEVar4->Kind = DoubleExpression;
    (pEVar4->super_AST)._vptr_AST = (_func_int **)&PTR__AST_0011f8a0;
    *(anon_union_8_3_6d9870f7_for_CMMLexer_5 *)(pEVar4 + 1) = aVar1;
    break;
  case Boolean:
    pEVar4 = (ExpressionAST *)operator_new(0x10);
    bVar3 = (this->Lexer).field_4.BoolVal;
    pEVar4->Kind = BoolExpression;
    (pEVar4->super_AST)._vptr_AST = (_func_int **)&PTR__AST_0011f8e0;
    pEVar4->field_0xc = bVar3;
  }
  pEVar5 = (Res->_M_t).
           super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
           super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
           super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
  (Res->_M_t).super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>.
  _M_t.super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
  super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl = pEVar4;
LAB_00108f93:
  if (pEVar5 != (ExpressionAST *)0x0) {
    (*(pEVar5->super_AST)._vptr_AST[1])();
  }
  CMMLexer::Lex(&this->Lexer);
  return false;
}

Assistant:

bool CMMParser::parseConstantExpression(std::unique_ptr<ExpressionAST> &Res) {
  switch (getKind()) {
  default:  return Error("unknown token in literal constant expression");
  case Token::Integer:  Res.reset(new IntAST(Lexer.getIntVal())); break;
  case Token::Double:   Res.reset(new DoubleAST(Lexer.getDoubleVal())); break;
  case Token::Boolean:  Res.reset(new BoolAST(Lexer.getBoolVal())); break;
  case Token::String:   Res.reset(new StringAST(Lexer.getStrVal())); break;
  }
  Lex(); // eat the string,bool,int,double.
  return false;
}